

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeRAW.cpp
# Opt level: O2

uint __thiscall FormatTypeRAW::ComputeTrack(FormatTypeRAW *this,int index,Revolution *revolution)

{
  uint uVar1;
  pointer paVar2;
  FluxElement *pFVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  Revolution *pRVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  
  lVar11 = (long)index;
  paVar2 = (this->index_list_).
           super__Vector_base<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = paVar2[lVar11 + 1].flux_value;
  uVar10 = (ulong)this->nb_flux_value_;
  pFVar3 = this->flux_list_;
  for (uVar18 = 0; uVar6 = uVar10, uVar19 = uVar10, uVar10 != uVar18; uVar18 = uVar18 + 1) {
    if (paVar2[lVar11].stream_position <= pFVar3[uVar18].stream_position) {
      uVar6 = uVar18 & 0xffffffff;
      uVar19 = uVar18;
      break;
    }
  }
  uVar14 = (uint)uVar6;
  uVar18 = uVar10;
  if (this->nb_flux_value_ < uVar14) {
    uVar18 = uVar6;
  }
  do {
    uVar15 = (uint)uVar18;
    if (uVar10 <= uVar19) {
LAB_0016e373:
      iVar16 = 0;
      uVar10 = 0;
      iVar12 = 0;
      if (uVar14 != 0) {
        iVar12 = pFVar3[uVar14 - 1].flux_value - paVar2[lVar11].flux_value;
        if (pFVar3[uVar14 - 1].flux_value < paVar2[lVar11].flux_value || iVar12 == 0) {
          uVar10 = 0;
        }
        else {
          uVar4 = iVar12 * 0xa293;
          iVar12 = 0;
          uVar10 = (ulong)uVar4 / 1000;
        }
      }
      pRVar8 = revolution + lVar11;
      uVar4 = 2000;
      uVar18 = 0;
      iVar17 = 0;
      while( true ) {
        iVar9 = (int)uVar10;
        uVar13 = uVar4 >> 1;
        uVar5 = (uint)uVar6;
        if (uVar15 <= uVar5) break;
        if (iVar9 < (int)uVar13) {
          uVar7 = this->flux_list_[uVar6].flux_value;
          if (uVar5 == uVar14) {
            uVar7 = uVar7 + iVar12;
          }
          else if (uVar5 + 1 == uVar15) {
            iVar17 = (int)(((double)uVar1 * 41619.0) / 1000.0 - (double)(int)uVar4);
          }
          iVar16 = 0;
          iVar9 = iVar9 + (uVar7 * 0xa293) / 1000;
          uVar5 = uVar5 + 1;
        }
        uVar7 = iVar9 - uVar4;
        uVar10 = (ulong)uVar7;
        if ((int)uVar7 < (int)uVar13) {
          if (revolution != (Revolution *)0x0) {
            pRVar8->bitfield[uVar18] = '\x01';
          }
          if (iVar16 - 1U < 3) {
            uVar6 = (long)(int)uVar7 / (long)(iVar16 + 1);
            uVar10 = uVar6 & 0xffffffff;
            uVar13 = (uint)uVar6;
            iVar9 = 5;
          }
          else {
            uVar13 = 2000 - uVar4;
            uVar10 = (ulong)uVar13;
            iVar9 = 0x14;
          }
          uVar4 = (int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar10) / (long)iVar9) +
                  uVar4;
          if (0x897 < (int)uVar4) {
            uVar4 = 0x898;
          }
          if ((int)uVar4 < 0x709) {
            uVar4 = 0x708;
          }
          uVar10 = (long)(int)uVar7 / 2 & 0xffffffff;
        }
        else {
          if (revolution != (Revolution *)0x0) {
            pRVar8->bitfield[uVar18] = '\0';
          }
          iVar16 = iVar16 + 1;
        }
        uVar18 = (ulong)((int)uVar18 + 1);
        uVar6 = (ulong)uVar5;
      }
      while( true ) {
        iVar12 = (int)uVar10;
        if ((iVar12 < (int)uVar13) || (iVar17 < 1)) break;
        if (revolution != (Revolution *)0x0) {
          pRVar8->bitfield[uVar18] = (int)(iVar12 - uVar4) < (int)uVar13;
        }
        uVar10 = (ulong)(iVar12 - uVar4);
        iVar17 = iVar17 - uVar4;
        uVar18 = (ulong)((uint)uVar18 + 1);
      }
      return (uint)uVar18;
    }
    if (pFVar3[uVar19].stream_position == paVar2[lVar11 + 1].stream_position) {
      uVar15 = (uint)uVar19;
      goto LAB_0016e373;
    }
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

unsigned int FormatTypeRAW::ComputeTrack(int index, IDisk::Revolution* revolution)
{
#define CLOCK_MAX_ADJ 10
#define CLOCK_MIN(_c) (((_c) * (100 - CLOCK_MAX_ADJ)) / 100)
#define CLOCK_MAX(_c) (((_c) * (100 + CLOCK_MAX_ADJ)) / 100)

#define MCK_FREQ (((18432000 * 73) / 14) / 2)
#define SCK_FREQ (MCK_FREQ / 2)
#define ICK_FREQ (MCK_FREQ / 16)
#define SCK_PS_PER_TICK (1000000000/(SCK_FREQ/1000))
#define PERIOD_ADJ_PCT 5

   int flux = 0;
   int clock = 2000; // 2 us
   int clock_centre = clock;
   unsigned int i = 0;
   unsigned int nb_bit_in_flux = 0;
   int clocked_zeros = 0;

   IndexElement debut = index_list_[index];
   IndexElement fin = index_list_[index + 1];

   unsigned int j;
   double first_flux_value = 0, last_flux_value = 0;
   // Get next cell
   for (i = 0; i < nb_flux_value_; i++)
   {
      if (flux_list_[i].stream_position >= debut.stream_position)
      {
         break;
      }
   }
   for (j = i; j < nb_flux_value_; j++)
   {
      if (flux_list_[j].stream_position == fin.stream_position)
      {
         //last_flux_value = fin.flux_value; // m_FluxList[j].flux_value;
         //j --;
         break;
      }
   }
   nb_bit_in_flux = 0;

   // Get the proper first cell
   first_flux_value = debut.flux_value;
   last_flux_value = fin.flux_value;

   int remaining = 0;
   int remaining_negative = 0;
   // Value of the first cell :
   if (i > 0)
   {
      if (flux_list_[i - 1].flux_value > first_flux_value)
         remaining = flux_list_[i - 1].flux_value - static_cast<int>(first_flux_value);
      else
         remaining_negative = static_cast<int>(first_flux_value) - flux_list_[i - 1].flux_value;
   }

   // Adjust first / last, to avoid having a double bit


   // Cell first ??
   flux = (remaining * SCK_PS_PER_TICK) / 1000u;
   int end_flux = 0;
   //flux = remaining;

   unsigned int k = i;
   //i = 0;
   //while (i < sizeOfBuffer*2)
   for (; k < j;)
   {
      // What's the current flux status
      // Under a half clock : add the next one
      if (flux < clock / 2 && k < j)
      {
         int localflux = flux_list_[k++].flux_value;
         if (k - 1 == i)
         {
            localflux -= remaining_negative;
         }
         else if (k == j)
         {
            end_flux = static_cast<int>((last_flux_value * SCK_PS_PER_TICK) / 1000u - clock);
            // Compute last flux : It's xomputed to know WHEN to stop, not WHAT is it containing.

            /*
            if (last_flux_value < localflux)
            localflux = last_flux_value;
            else
            {
            // To check
            int dbg = 1;
            localflux = last_flux_value;
            }*/
         }

         flux += (localflux * SCK_PS_PER_TICK) / 1000u;
         clocked_zeros = 0;
      }

      // Remove a clock value to the flux
      flux -= clock;

      // If it remains at least a half clock : A zero's there
      if (flux >= clock / 2)
      {
         if (revolution != NULL) revolution[index].bitfield[nb_bit_in_flux] = 0;
         clocked_zeros++;
         nb_bit_in_flux++;
      }
      else
      {
         // Otherwise, we have a one
         if (revolution != NULL) revolution[index].bitfield[nb_bit_in_flux] = 1;
         nb_bit_in_flux++;

         // PLL computations HERE !
         if ((clocked_zeros >= 1) && (clocked_zeros <= 3))
         {
            // In sync: adjust base clock by 10% of phase mismatch.
            int diff = flux / (int)(clocked_zeros + 1);
            clock += diff / PERIOD_ADJ_PCT;
         }
         else
         {
            clock += (clock_centre - clock) * PERIOD_ADJ_PCT / 100;
         }


         clock = max(CLOCK_MIN(clock_centre),
                     min(CLOCK_MAX(clock_centre), clock));

         flux = flux / 2;
      }
   }

   // End adjustement
   while (flux >= clock / 2 && end_flux > 0)
   {
      flux -= clock;
      end_flux -= clock;

      // If it remains at least a half clock : A zero's there
      if (flux >= clock / 2)
      {
         if (revolution != NULL) revolution[index].bitfield[nb_bit_in_flux] = 0;
         clocked_zeros++;
         nb_bit_in_flux++;
      }
      else
      {
         // NOT ALWAYS : We have a ending one when the last flux reversal is smaller than the flux index
         // Otherwise, we have a one
         //if (last_flux_value > m_FluxList[j-1].flux_value )
         // This should be rethought and adjusted.... TODO
         //if (flux >= -(clock / 2))
         {
            // To check
            if (revolution != NULL) revolution[index].bitfield[nb_bit_in_flux] = 1;
            nb_bit_in_flux++;
         }
      }
   }

   return nb_bit_in_flux;
}